

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

void sysbvm_astInterpreter_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_interpreter_primitive_loadSourceNamedWithSolvedPath,
             "Interpreter::loadSourceNamedWithSolvedPath:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_interpreter_primitive_loadSourceNamedMacro,"Interpreter::loadSourceNamedMacro:")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSequenceNode_primitiveMacro,"ASTSequenceNode::beginMacro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astArgumentNode_primitiveAnalyze,"ASTArgumentNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astCoerceValueNode_primitiveMacro,"ASTCoerceValueNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astCoerceValueNode_primitiveAnalyze,
             "ASTCoerceValueNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astCoerceValueNode_primitiveEvaluate,
             "ASTCoerceValueNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astCoerceValueNode_primitiveAnalyzeAndEvaluate,
             "ASTCoerceValueNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDownCastNode_primitiveMacro,"ASTDownCastNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDownCastNode_primitiveAnalyze,"ASTDownCastNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDownCastNode_primitiveEvaluate,"ASTDownCastNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate,
             "ASTDownCastNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astErrorNode_primitiveEvaluate,"ASTErrorNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astPragmaNode_primitiveAnalyze,"ASTPragmaNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSequenceNode_primitiveAnalyze,"ASTSequenceNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSequenceNode_primitiveEvaluate,"ASTSequenceNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate,
             "ASTSequenceNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLiteralNode_primitiveAnalyze,"ASTLiteralNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLiteralNode_primitiveEvaluate,"ASTLiteralNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIdentifierReferenceNode_primitiveAnalyze,
             "ASTIdentifierReferenceNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIdentifierReferenceNode_primitiveEvaluate,
             "ASTIdentifierReferenceNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate,
             "ASTIdentifierReferenceNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUnexpandedApplicationNode_primitiveAnalyze,
             "ASTUnexpandedApplicationNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate,
             "ASTUnexpandedApplicationNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze,
             "ASTUnexpandedSExpressionNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate,
             "ASTUnexpandedSExpressionNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astFunctionApplicationNode_primitiveAnalyze,
             "ASTFunctionApplicationNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astFunctionApplicationNode_primitiveEvaluate,
             "ASTFunctionApplicationNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate,
             "ASTFunctionApplicationNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLexicalBlockNode_primitiveAnalyze,
             "ASTLexicalBlockNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLexicalBlockNode_primitiveEvaluate,
             "ASTLexicalBlockNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLexicalBlockNode_primitiveAnalyzeAndEvaluate,
             "ASTLexicalBlockNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeAssociationNode_primitiveAnalyze,
             "ASTMakeAssociationNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeAssociationNode_primitiveEvaluate,
             "ASTMakeAssociationNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeAssociationNode_primitiveAnalyzeAndEvaluate,
             "ASTMakeAssociationNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeByteArrayNode_primitiveAnalyze,
             "ASTMakeByteArrayNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeByteArrayNode_primitiveEvaluate,
             "ASTMakeByteArrayNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate,
             "ASTMakeByteArrayNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeDictionaryNode_primitiveAnalyze,
             "ASTMakeDictionaryNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeDictionaryNode_primitiveEvaluate,
             "ASTMakeDictionaryNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeDictionaryNode_primitiveAnalyzeAndEvaluate,
             "ASTMakeDictionaryNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeArrayNode_primitiveAnalyze,"ASTMakeArrayNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeArrayNode_primitiveEvaluate,"ASTMakeArrayNode::evaluateWithEnvironment:")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeArrayNode_primitiveAnalyzeAndEvaluate,
             "ASTMakeArrayNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageChainNode_primitiveAnalyze,
             "ASTMessageChainNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageChainNode_primitiveEvaluate,
             "ASTMessageChainNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate,
             "ASTMessageChainNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageSendNode_primitiveAnalyze,
             "ASTMessageSendNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageSendNode_primitiveEvaluate,
             "ASTMessageSendNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate,
             "ASTMessageSendNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLambdaNode_primitiveAnalyze,"ASTLambdaNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLambdaNode_primitiveEvaluate,"ASTLambdaNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate,
             "ASTLambdaNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_letWithPrimitiveMacro,
             "ASTVariableDefinitionNode::let:with:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro,
             "ASTVariableDefinitionNode::let:type:with:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_letMutableWithPrimitiveMacro,
             "ASTVariableDefinitionNode::let:mutableWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_letTypeMutableWithPrimitiveMacro,
             "ASTVariableDefinitionNode::let:type:mutableWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro,
             "ASTVariableDefinitionNode::macroLet:with:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_primitiveAnalyze,
             "ASTVariableDefinitionNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_primitiveEvaluate,
             "ASTVariableDefinitionNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate,
             "ASTVariableDefinitionNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleWithLookupStartingFromNode_primitiveMacro,
             "ASTTupleWithLookupStartingFromNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze,
             "ASTTupleWithLookupStartingFromNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleWithLookupStartingFromNode_primitiveEvaluate,
             "ASTTupleWithLookupStartingFromNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyzeAndEvaluate,
             "ASTTupleWithLookupStartingFromNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtNode_primitiveMacro,"ASTTupleSlotNamedAtNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze,
             "ASTTupleSlotNamedAtNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate,
             "ASTTupleSlotNamedAtNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate,
             "ASTTupleSlotNamedAtNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedReferenceAtNode_primitiveMacro,
             "ASTTupleSlotNamedReferenceAtNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze,
             "ASTTupleSlotNamedReferenceAtNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedReferenceAtNode_primitiveEvaluate,
             "ASTTupleSlotNamedReferenceAtNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate,
             "ASTTupleSlotNamedReferenceAtNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtPutNode_primitiveMacro,"ASTTupleSlotNamedAtPutNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze,
             "ASTTupleSlotNamedAtPutNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate,
             "ASTTupleSlotNamedAtPutNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyzeAndEvaluate,
             "ASTTupleSlotNamedAtPutNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveMacro,"ASTIfNode::if:then:else:")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIfNode_primitiveMacroIfThen,"ASTIfNode::if:then:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIfNode_primitiveAnalyze,"ASTIfNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIfNode_primitiveEvaluate,"ASTIfNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIfNode_primitiveAnalyzeAndEvaluate,
             "ASTIfNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveMacro,
             "ASTDoWhileContinueWithNode::do:while:continueWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveDoWhileMacro,
             "ASTDoWhileContinueWithNode::do:while:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveAnalyze,
             "ASTDoWhileContinueWithNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveEvaluate,
             "ASTDoWhileContinueWithNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveAnalyzeAndEvaluate,
             "ASTDoWhileContinueWithNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUseNamedSlotsOfNode_primitiveMacro,"ASTUseNamedSlotsOfNode::useNamedSlotsOf:"
            );
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze,
             "ASTUseNamedSlotsOfNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate,
             "ASTUseNamedSlotsOfNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate,
             "ASTUseNamedSlotsOfNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueWithNode_primitiveMacro,
             "ASTWhileContinueWithNode::while:do:continueWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueWithNode_primitiveWhileDoMacro,
             "ASTWhileContinueWithNode::while:do:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueWithNode_primitiveAnalyze,
             "ASTWhileContinueWithNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueWithNode_primitiveEvaluate,
             "ASTWhileContinueWithNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueWithNode_primitiveAnalyzeAndEvaluate,
             "ASTWhileContinueWithNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction(sysbvm_astBreakNode_primitiveMacro,"ASTBreakNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astBreakNode_primitiveAnalyze,"ASTBreakNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astBreakNode_primitiveEvaluate,"ASTBreakNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astContinueNode_primitiveMacro,"ASTContinueNode::macro");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astContinueNode_primitiveAnalyze,"ASTContinueNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astContinueNode_primitiveEvaluate,"ASTContinueNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astReturnNode_primitiveMacro,"ASTReturnNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astReturnNode_primitiveAnalyze,"ASTReturnNode::analyzeWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astReturnNode_primitiveEvaluate,"ASTReturnNode::evaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate,
             "ASTReturnNode::analyzeAndEvaluateWithEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitiveEnsureAnalysis,"Function::ensureAnalysis");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_functionDefinition_primitiveEnsureTypeAnalysis,
             "FunctionDefinition::ensureTypeAnalysis");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_functionDefinition_primitiveEnsureAnalysis,"FunctionDefinition::ensureAnalysis")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode,
             "SimpleFunctionType::analyzeAndTypeCheckFunctionApplicationNode:withEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode,
             "SimpleFunctionType::analyzeAndTypeCheckSolvedMessageSendNode:withEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode,
             "DependentFunctionType::analyzeAndTypeCheckFunctionApplicationNode:withEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode,
             "DependentFunctionType::analyzeAndTypeCheckSolvedMessageSendNode:withEnvironment:");
  return;
}

Assistant:

void sysbvm_astInterpreter_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_interpreter_primitive_loadSourceNamedWithSolvedPath, "Interpreter::loadSourceNamedWithSolvedPath:");
    sysbvm_primitiveTable_registerFunction(sysbvm_interpreter_primitive_loadSourceNamedMacro, "Interpreter::loadSourceNamedMacro:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astSequenceNode_primitiveMacro, "ASTSequenceNode::beginMacro");

    sysbvm_primitiveTable_registerFunction(sysbvm_astArgumentNode_primitiveAnalyze, "ASTArgumentNode::analyzeWithEnvironment:");
    
    sysbvm_primitiveTable_registerFunction(sysbvm_astCoerceValueNode_primitiveMacro, "ASTCoerceValueNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astCoerceValueNode_primitiveAnalyze, "ASTCoerceValueNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astCoerceValueNode_primitiveEvaluate, "ASTCoerceValueNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astCoerceValueNode_primitiveAnalyzeAndEvaluate, "ASTCoerceValueNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astDownCastNode_primitiveMacro, "ASTDownCastNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDownCastNode_primitiveAnalyze, "ASTDownCastNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDownCastNode_primitiveEvaluate, "ASTDownCastNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate, "ASTDownCastNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astErrorNode_primitiveEvaluate, "ASTErrorNode::analyzeWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astPragmaNode_primitiveAnalyze, "ASTPragmaNode::analyzeWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astSequenceNode_primitiveAnalyze, "ASTSequenceNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astSequenceNode_primitiveEvaluate, "ASTSequenceNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate, "ASTSequenceNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astLiteralNode_primitiveAnalyze, "ASTLiteralNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLiteralNode_primitiveEvaluate, "ASTLiteralNode::evaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astIdentifierReferenceNode_primitiveAnalyze, "ASTIdentifierReferenceNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIdentifierReferenceNode_primitiveEvaluate, "ASTIdentifierReferenceNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate, "ASTIdentifierReferenceNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astUnexpandedApplicationNode_primitiveAnalyze, "ASTUnexpandedApplicationNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate, "ASTUnexpandedApplicationNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze, "ASTUnexpandedSExpressionNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate, "ASTUnexpandedSExpressionNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astFunctionApplicationNode_primitiveAnalyze, "ASTFunctionApplicationNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astFunctionApplicationNode_primitiveEvaluate, "ASTFunctionApplicationNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate, "ASTFunctionApplicationNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astLexicalBlockNode_primitiveAnalyze, "ASTLexicalBlockNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLexicalBlockNode_primitiveEvaluate, "ASTLexicalBlockNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLexicalBlockNode_primitiveAnalyzeAndEvaluate, "ASTLexicalBlockNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeAssociationNode_primitiveAnalyze, "ASTMakeAssociationNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeAssociationNode_primitiveEvaluate, "ASTMakeAssociationNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeAssociationNode_primitiveAnalyzeAndEvaluate, "ASTMakeAssociationNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeByteArrayNode_primitiveAnalyze, "ASTMakeByteArrayNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeByteArrayNode_primitiveEvaluate, "ASTMakeByteArrayNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate, "ASTMakeByteArrayNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeDictionaryNode_primitiveAnalyze, "ASTMakeDictionaryNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeDictionaryNode_primitiveEvaluate, "ASTMakeDictionaryNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeDictionaryNode_primitiveAnalyzeAndEvaluate, "ASTMakeDictionaryNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeArrayNode_primitiveAnalyze, "ASTMakeArrayNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeArrayNode_primitiveEvaluate, "ASTMakeArrayNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeArrayNode_primitiveAnalyzeAndEvaluate, "ASTMakeArrayNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageChainNode_primitiveAnalyze, "ASTMessageChainNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageChainNode_primitiveEvaluate, "ASTMessageChainNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate, "ASTMessageChainNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageSendNode_primitiveAnalyze, "ASTMessageSendNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageSendNode_primitiveEvaluate, "ASTMessageSendNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate, "ASTMessageSendNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astLambdaNode_primitiveAnalyze, "ASTLambdaNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLambdaNode_primitiveEvaluate, "ASTLambdaNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate, "ASTLambdaNode::analyzeWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_letWithPrimitiveMacro, "ASTVariableDefinitionNode::let:with:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro, "ASTVariableDefinitionNode::let:type:with:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_letMutableWithPrimitiveMacro, "ASTVariableDefinitionNode::let:mutableWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_letTypeMutableWithPrimitiveMacro, "ASTVariableDefinitionNode::let:type:mutableWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro, "ASTVariableDefinitionNode::macroLet:with:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_primitiveAnalyze, "ASTVariableDefinitionNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_primitiveEvaluate, "ASTVariableDefinitionNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate, "ASTVariableDefinitionNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleWithLookupStartingFromNode_primitiveMacro, "ASTTupleWithLookupStartingFromNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze, "ASTTupleWithLookupStartingFromNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleWithLookupStartingFromNode_primitiveEvaluate, "ASTTupleWithLookupStartingFromNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyzeAndEvaluate, "ASTTupleWithLookupStartingFromNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtNode_primitiveMacro, "ASTTupleSlotNamedAtNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze, "ASTTupleSlotNamedAtNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate, "ASTTupleSlotNamedAtNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate, "ASTTupleSlotNamedAtNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedReferenceAtNode_primitiveMacro, "ASTTupleSlotNamedReferenceAtNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze, "ASTTupleSlotNamedReferenceAtNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedReferenceAtNode_primitiveEvaluate, "ASTTupleSlotNamedReferenceAtNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate, "ASTTupleSlotNamedReferenceAtNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtPutNode_primitiveMacro, "ASTTupleSlotNamedAtPutNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze, "ASTTupleSlotNamedAtPutNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate, "ASTTupleSlotNamedAtPutNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyzeAndEvaluate, "ASTTupleSlotNamedAtPutNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveMacro, "ASTIfNode::if:then:else:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveMacroIfThen, "ASTIfNode::if:then:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveAnalyze, "ASTIfNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveEvaluate, "ASTIfNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveAnalyzeAndEvaluate, "ASTIfNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveMacro, "ASTDoWhileContinueWithNode::do:while:continueWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveDoWhileMacro, "ASTDoWhileContinueWithNode::do:while:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveAnalyze, "ASTDoWhileContinueWithNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveEvaluate, "ASTDoWhileContinueWithNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveAnalyzeAndEvaluate, "ASTDoWhileContinueWithNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astUseNamedSlotsOfNode_primitiveMacro, "ASTUseNamedSlotsOfNode::useNamedSlotsOf:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze, "ASTUseNamedSlotsOfNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate, "ASTUseNamedSlotsOfNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate, "ASTUseNamedSlotsOfNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueWithNode_primitiveMacro, "ASTWhileContinueWithNode::while:do:continueWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueWithNode_primitiveWhileDoMacro, "ASTWhileContinueWithNode::while:do:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueWithNode_primitiveAnalyze, "ASTWhileContinueWithNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueWithNode_primitiveEvaluate, "ASTWhileContinueWithNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueWithNode_primitiveAnalyzeAndEvaluate, "ASTWhileContinueWithNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astBreakNode_primitiveMacro, "ASTBreakNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astBreakNode_primitiveAnalyze, "ASTBreakNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astBreakNode_primitiveEvaluate, "ASTBreakNode::evaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astContinueNode_primitiveMacro, "ASTContinueNode::macro");
    sysbvm_primitiveTable_registerFunction(sysbvm_astContinueNode_primitiveAnalyze, "ASTContinueNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astContinueNode_primitiveEvaluate, "ASTContinueNode::evaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_astReturnNode_primitiveMacro, "ASTReturnNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astReturnNode_primitiveAnalyze, "ASTReturnNode::analyzeWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astReturnNode_primitiveEvaluate, "ASTReturnNode::evaluateWithEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate, "ASTReturnNode::analyzeAndEvaluateWithEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitiveEnsureAnalysis, "Function::ensureAnalysis");
    sysbvm_primitiveTable_registerFunction(sysbvm_functionDefinition_primitiveEnsureTypeAnalysis, "FunctionDefinition::ensureTypeAnalysis");
    sysbvm_primitiveTable_registerFunction(sysbvm_functionDefinition_primitiveEnsureAnalysis, "FunctionDefinition::ensureAnalysis");

    sysbvm_primitiveTable_registerFunction(sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode, "SimpleFunctionType::analyzeAndTypeCheckFunctionApplicationNode:withEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode, "SimpleFunctionType::analyzeAndTypeCheckSolvedMessageSendNode:withEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode, "DependentFunctionType::analyzeAndTypeCheckFunctionApplicationNode:withEnvironment:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode, "DependentFunctionType::analyzeAndTypeCheckSolvedMessageSendNode:withEnvironment:");
}